

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O3

void __thiscall aalcalc::doit(aalcalc *this,string *subfolder)

{
  pointer pdVar1;
  int iVar2;
  uint uVar3;
  uint extraout_EAX;
  FILE *pFVar4;
  char *pcVar5;
  size_t sVar6;
  undefined8 extraout_RAX;
  sampleslevelRec sVar7;
  FILE *__stream;
  _Base_ptr p_Var8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  int iVar9;
  aalcalc *this_01;
  sampleslevelRec __s;
  int period_no;
  int summary_id;
  string s;
  string filename;
  vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_> filehandles;
  sampleslevelRec sr;
  int file_index;
  string path;
  longlong file_offset;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filelist;
  FILE *in;
  char line [4096];
  int local_1130;
  int local_112c;
  aalcalc *local_1128;
  int local_1120;
  int local_111c;
  undefined1 local_1118 [8];
  sampleslevelRec sStack_1110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1108;
  undefined1 local_10f8 [32];
  _Base_ptr local_10d8;
  iterator iStack_10d0;
  _Base_ptr local_10c8;
  sampleslevelRec local_10c0;
  int local_10b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10b0;
  FILE *local_1090;
  vector<double,_std::allocator<double>_> *local_1088;
  _Base_ptr local_1080;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1078;
  undefined1 local_1058 [32];
  sampleslevelRec local_1038 [2];
  undefined1 local_1028 [4088];
  
  std::operator+(&local_10b0,"work/",subfolder);
  std::__cxx11::string::substr((ulong)local_1038,(ulong)&local_10b0);
  iVar2 = std::__cxx11::string::compare((char *)local_1038);
  __s = (sampleslevelRec)local_1028;
  if (local_1038[0] != __s) {
    operator_delete((void *)local_1038[0]);
  }
  if (iVar2 != 0) {
    local_1038[0] = __s;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1038,local_10b0._M_dataplus._M_p,
               local_10b0._M_dataplus._M_p +
               (long)(_Vector_base<double,_std::allocator<double>_> *)local_10b0._M_string_length);
    std::__cxx11::string::append((char *)local_1038);
    std::__cxx11::string::operator=((string *)&local_10b0,(string *)local_1038);
    if (local_1038[0] != __s) {
      operator_delete((void *)local_1038[0]);
    }
  }
  loadoccurrence(this);
  summaryindex::doit(&local_10b0,&this->event_to_period_);
  initsamplesize(this,&local_10b0);
  getmaxsummaryid(this,&local_10b0);
  getsamplesizes(this);
  loadperiodtoweighting(this);
  loadensemblemapping(this);
  local_1088 = &this->vec_sample_sum_loss_;
  local_10f8._0_8_ = (_Base_ptr)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (local_1088,(long)this->samplesize_ + 1,(value_type_conflict2 *)local_10f8);
  std::vector<aal_rec_ensemble,_std::allocator<aal_rec_ensemble>_>::resize
            (&this->vec_ensemble_aal_,(long)this->max_ensemble_id_ * (long)this->max_summary_id_ + 1
            );
  std::vector<aal_rec,_std::allocator<aal_rec>_>::resize
            (&this->vec_analytical_aal_,(long)this->max_summary_id_ + 1);
  local_1078.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1078.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1078.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_10c8 = (_Base_ptr)0x0;
  local_10d8 = (_Base_ptr)0x0;
  iStack_10d0._M_current = (_IO_FILE **)0x0;
  local_10f8._0_8_ = local_10f8 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_10f8,local_10b0._M_dataplus._M_p,
             local_10b0._M_dataplus._M_p +
             (long)(_Vector_base<double,_std::allocator<double>_> *)local_10b0._M_string_length);
  std::__cxx11::string::append(local_10f8);
  local_1128 = this;
  pFVar4 = fopen((char *)local_10f8._0_8_,"rb");
  if (pFVar4 == (FILE *)0x0) {
LAB_001044d0:
    doit((aalcalc *)local_10f8);
  }
  else {
    pcVar5 = fgets((char *)local_1038,0x1000,pFVar4);
    if (pcVar5 != (char *)0x0) {
      this_00 = &local_1078;
      do {
        pcVar5 = strchr((char *)local_1038,10);
        if (pcVar5 != (char *)0x0) {
          *pcVar5 = '\0';
        }
        local_1118 = (undefined1  [8])&local_1108;
        sVar6 = strlen((char *)local_1038);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1118,local_1038,(long)&local_1038[0].sidx + sVar6);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1058,&local_10b0,(value_type *)local_1118);
        std::__cxx11::string::operator=((string *)local_10f8,(string *)local_1058);
        if ((FILE *)local_1058._0_8_ != (FILE *)(local_1058 + 0x10)) {
          operator_delete((void *)local_1058._0_8_);
        }
        local_1058._0_8_ = fopen((char *)local_10f8._0_8_,"rb");
        if ((FILE *)local_1058._0_8_ == (FILE *)0x0) {
          doit((aalcalc *)local_1118);
          uVar3 = extraout_EAX;
          goto LAB_0010449c;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(this_00,(value_type *)local_1118);
        if ((_Base_ptr)iStack_10d0._M_current == local_10c8) {
          std::vector<_IO_FILE*,std::allocator<_IO_FILE*>>::_M_realloc_insert<_IO_FILE*const&>
                    ((vector<_IO_FILE*,std::allocator<_IO_FILE*>> *)&local_10d8,iStack_10d0,
                     (_IO_FILE **)local_1058);
        }
        else {
          *iStack_10d0._M_current = (_IO_FILE *)local_1058._0_8_;
          iStack_10d0._M_current = iStack_10d0._M_current + 1;
        }
        if (local_1118 != (undefined1  [8])&local_1108) {
          operator_delete((void *)local_1118);
        }
        pcVar5 = fgets((char *)local_1038,0x1000,pFVar4);
      } while (pcVar5 != (char *)0x0);
    }
    fclose(pFVar4);
    __s = (sampleslevelRec)&local_1108;
    local_1118 = (undefined1  [8])__s;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1118,local_10b0._M_dataplus._M_p,
               local_10b0._M_dataplus._M_p +
               (long)(_Vector_base<double,_std::allocator<double>_> *)local_10b0._M_string_length);
    std::__cxx11::string::append(local_1118);
    this_01 = local_1128;
    std::__cxx11::string::operator=((string *)local_10f8,(string *)local_1118);
    if ((sampleslevelRec)local_1118 != __s) {
      operator_delete((void *)local_1118);
    }
    pFVar4 = fopen((char *)local_10f8._0_8_,"rb");
    if (pFVar4 != (FILE *)0x0) {
      pcVar5 = fgets((char *)local_1038,0x1000,pFVar4);
      if (pcVar5 == (char *)0x0) {
        fclose(pFVar4);
        this_01->current_summary_id_ = -1;
      }
      else {
        this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x1;
        local_1120 = -1;
        __s = (sampleslevelRec)local_1038;
        __stream = (FILE *)0x0;
        iVar2 = -1;
        local_1130 = -1;
        local_1090 = pFVar4;
        do {
          uVar3 = __isoc99_sscanf(__s,"%d, %d, %d, %lld",&local_111c,&local_10b4,&local_112c,
                                  &local_1080);
          if (uVar3 != 4) {
LAB_0010449c:
            fprintf(_stderr,"FATAL:Invalid data in line %d:\n%s %d",(ulong)this_00 & 0xffffffff,
                    local_1038,(ulong)uVar3);
            exit(-1);
          }
          if (local_1130 == local_111c) {
            iVar9 = iVar2;
            if ((iVar2 != local_112c) && (iVar9 = local_112c, iVar2 != -1)) {
              do_calc_end(local_1128,iVar2);
              iVar9 = local_112c;
            }
          }
          else {
            if (local_1130 != -1) {
              do_calc_end(local_1128,iVar2);
            }
            local_1128->current_summary_id_ = local_111c;
            iVar9 = local_112c;
            local_1130 = local_111c;
          }
          iVar2 = iVar9;
          if (local_1120 != local_10b4) {
            __stream = *(FILE **)(&local_10d8->_M_color + (long)local_10b4 * 2);
            local_1120 = local_10b4;
          }
          if (__stream == (FILE *)0x0) {
            doit();
            goto LAB_001044d0;
          }
          local_1118._0_4_ = 0;
          local_1118._4_4_ = 0.0;
          sStack_1110.sidx = 0;
          sStack_1110.loss = 0.0;
          local_1108._M_allocated_capacity._0_4_ = 0;
          local_1108._M_allocated_capacity._4_4_ = 0.0;
          fseek(__stream,(long)local_1080,0);
          sVar6 = fread(local_1058,0xc,1,__stream);
          if ((sVar6 != 0) &&
             (sVar6 = fread(&local_10c0,8,1,__stream), local_10c0.sidx != _S_red && sVar6 != 0)) {
            do {
              if (1 < local_10c0.sidx + 5) {
                if (sStack_1110 == (sampleslevelRec)local_1108._M_allocated_capacity) {
                  std::vector<sampleslevelRec,std::allocator<sampleslevelRec>>::
                  _M_realloc_insert<sampleslevelRec_const&>
                            ((vector<sampleslevelRec,std::allocator<sampleslevelRec>> *)local_1118,
                             (iterator)sStack_1110,&local_10c0);
                }
                else {
                  sVar7.loss = local_10c0.loss;
                  sVar7.sidx = local_10c0.sidx;
                  *(sampleslevelRec *)sStack_1110 = sVar7;
                  sStack_1110 = (sampleslevelRec)((long)sStack_1110 + 8);
                }
              }
              sVar6 = fread(&local_10c0,8,1,__stream);
            } while ((sVar6 != 0) && (local_10c0.sidx != _S_red));
          }
          if ((sampleslevelRec)local_1118 != sStack_1110) {
            pdVar1 = (local_1088->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            sVar7 = (sampleslevelRec)local_1118;
            do {
              if (0.0 < *(float *)((long)sVar7 + 4)) {
                iVar9 = *(int *)sVar7;
                if (*(int *)sVar7 == -1) {
                  iVar9 = 0;
                }
                pdVar1[iVar9] = (double)*(float *)((long)sVar7 + 4) + pdVar1[iVar9];
              }
              sVar7 = (sampleslevelRec)((long)sVar7 + 8);
            } while (sVar7 != sStack_1110);
          }
          if ((sampleslevelRec)local_1118 != (sampleslevelRec)0x0) {
            operator_delete((void *)local_1118);
          }
          this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(ulong)((int)this_00 + 1);
          pcVar5 = fgets((char *)__s,0x1000,local_1090);
        } while (pcVar5 != (char *)0x0);
        fclose(local_1090);
        this_01 = local_1128;
        local_1128->current_summary_id_ = local_1130;
        if (local_1130 != -1) {
          do_calc_end(local_1128,iVar2);
        }
      }
      outputresultscsv_new(this_01);
      p_Var8 = local_10d8;
      if (local_10d8 != (_Base_ptr)iStack_10d0._M_current) {
        do {
          fclose(*(FILE **)p_Var8);
          p_Var8 = (_Base_ptr)&p_Var8->_M_parent;
        } while (p_Var8 != (_Base_ptr)iStack_10d0._M_current);
        if (p_Var8 != local_10d8) {
          iStack_10d0._M_current = (_IO_FILE **)local_10d8;
        }
      }
      if ((_Base_ptr)local_10f8._0_8_ != (_Base_ptr)(local_10f8 + 0x10)) {
        operator_delete((void *)local_10f8._0_8_);
      }
      if (local_10d8 != (_Base_ptr)0x0) {
        operator_delete(local_10d8);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1078);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_10b0._M_dataplus._M_p != &local_10b0.field_2) {
        operator_delete(local_10b0._M_dataplus._M_p);
      }
      return;
    }
  }
  doit((aalcalc *)local_10f8);
  if (local_1038[0] != __s) {
    operator_delete((void *)local_1038[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10b0._M_dataplus._M_p != &local_10b0.field_2) {
    operator_delete(local_10b0._M_dataplus._M_p);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void aalcalc::doit(const std::string& subfolder)
{
	std::string path = "work/" + subfolder;
	if (path.substr(path.length() - 1, 1) != "/") {
		path = path + "/";
	}
	loadoccurrence();
	summaryindex::doit(path, event_to_period_);
	initsamplesize(path);
	getmaxsummaryid(path);
	getsamplesizes();
	loadperiodtoweighting();
	loadensemblemapping();
	char line[4096];
	vec_sample_sum_loss_.resize(samplesize_+1, 0.0);
	vec_ensemble_aal_.resize(max_summary_id_ * max_ensemble_id_ + 1);
	vec_analytical_aal_.resize(max_summary_id_ + 1);
	std::vector<std::string> filelist;
	std::vector<FILE *> filehandles;
	std::string filename = path + "filelist.idx";
	FILE* fin = fopen(filename.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL:%s: cannot open %s\n", __func__, filename.c_str());
		exit(EXIT_FAILURE);
	}
	
	while (fgets(line, sizeof(line), fin) != 0) {
		char *pos;
		if ((pos = strchr(line, '\n')) != NULL) *pos = '\0';   // remove newline from buffer		
		std::string s = line;
		filename = path + s;
		FILE* in = fopen(filename.c_str(), "rb");
		if (in == NULL) {
			fprintf(stderr, "FATAL:%s: cannot open %s\n", __func__, s.c_str());
			exit(EXIT_FAILURE);
		}
		filelist.push_back(s);
		filehandles.push_back(in);
	}

	fclose(fin);

	int lineno = 1;
	filename = path + "summaries.idx";
	fin = fopen(filename.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL:%s: cannot open %s\n", __func__, filename.c_str());
		exit(EXIT_FAILURE);
	}

	int summary_id;
	int file_index;
	int period_no;
	long long file_offset;
	int last_summary_id = -1;
	int last_period_no = -1;
	int last_file_index = -1;
	FILE* summary_fin = nullptr;
	while (fgets(line, sizeof(line), fin) != 0)
	{
		int ret = sscanf(line, "%d, %d, %d, %lld", &summary_id,
				&file_index, &period_no, &file_offset);
		if (ret != 4) {
			fprintf(stderr, "FATAL:Invalid data in line %d:\n%s %d",
				lineno, line, ret);
			exit(-1);
		}
		else
		{
			if (last_summary_id != summary_id) {
				if (last_summary_id != -1) {
					do_calc_end(last_period_no);
				}
				last_period_no = -1;   // Reset
				current_summary_id_ = summary_id;
				last_summary_id = summary_id;
			}
			if (last_period_no != period_no) {
				if (last_period_no != -1) {
					do_calc_end(last_period_no);
				}
				last_period_no = period_no;
			}
			
			if (last_file_index != file_index) {
				last_file_index = file_index;
				summary_fin = filehandles[file_index];
			}
			if (summary_fin != nullptr) {
				std::vector<sampleslevelRec> vrec;
				flseek(summary_fin, file_offset, SEEK_SET);
				summarySampleslevelHeader sh;
				size_t i = fread(&sh, sizeof(sh), 1, summary_fin);
				while (i != 0) {
					sampleslevelRec sr;
					i = fread(&sr, sizeof(sr), 1, summary_fin);
					if (i == 0 || sr.sidx == 0) break;
					if (sr.sidx == number_of_affected_risk_idx || sr.sidx == max_loss_idx) continue;
					vrec.push_back(sr);
				}
				do_calc_by_period(sh, vrec);
			}else {
				fprintf(stderr, "FATAL:File handle is a nullptr");
				exit(EXIT_FAILURE);
			}

		}
		lineno++;
	}

	fclose(fin);
	current_summary_id_ = last_summary_id;
	if (last_summary_id != -1) do_calc_end(last_period_no);

	outputresultscsv_new();
	auto iter = filehandles.begin();
	while (iter != filehandles.end()) {
		fclose(*iter);
		iter++;
	}
	filehandles.clear();
}